

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O0

bool dxil_spv::analyze_dxil_buffer_access_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Op local_24;
  Op op;
  uint32_t opcode;
  CallInst *instruction_local;
  Impl *impl_local;
  
  _op = instruction;
  instruction_local = (CallInst *)impl;
  bVar1 = get_constant_operand(&instruction->super_Instruction,0,&local_24);
  if (bVar1) {
    switch(local_24) {
    case TextureStore:
    case BufferStore:
    case RawBufferStore:
      analyze_dxil_buffer_store((Impl *)instruction_local,_op,local_24);
      break;
    case BufferLoad:
    case RawBufferLoad:
      analyze_dxil_buffer_load((Impl *)instruction_local,_op,local_24);
      break;
    case BufferUpdateCounter:
      analyze_dxil_atomic_counter((Impl *)instruction_local,_op);
      break;
    default:
      break;
    case AtomicBinOp:
    case AtomicCompareExchange:
    case WriteSamplerFeedback:
    case WriteSamplerFeedbackBias:
    case WriteSamplerFeedbackLevel:
    case WriteSamplerFeedbackGrad:
      bVar1 = analyze_dxil_atomic_op((Impl *)instruction_local,_op);
      if (!bVar1) {
        return false;
      }
    }
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool analyze_dxil_buffer_access_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// The opcode is encoded as a constant integer.
	uint32_t opcode;
	if (!get_constant_operand(instruction, 0, &opcode))
		return false;

	auto op = static_cast<DXIL::Op>(opcode);

	switch (op)
	{
	case DXIL::Op::BufferLoad:
	case DXIL::Op::RawBufferLoad:
		analyze_dxil_buffer_load(impl, instruction, op);
		break;

	case DXIL::Op::AtomicCompareExchange:
	case DXIL::Op::AtomicBinOp:
	case DXIL::Op::WriteSamplerFeedback:
	case DXIL::Op::WriteSamplerFeedbackBias:
	case DXIL::Op::WriteSamplerFeedbackGrad:
	case DXIL::Op::WriteSamplerFeedbackLevel:
		// Writing sampler feedback is more or less equivalent to an atomic.
		if (!analyze_dxil_atomic_op(impl, instruction))
			return false;
		break;

	case DXIL::Op::TextureStore:
	case DXIL::Op::BufferStore:
	case DXIL::Op::RawBufferStore:
		// TextureStore only needed here to track AGS U64 image atomics.
		analyze_dxil_buffer_store(impl, instruction, op);
		break;

	case DXIL::Op::BufferUpdateCounter:
		analyze_dxil_atomic_counter(impl, instruction);
		break;

	default:
		break;
	}

	return true;
}